

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O1

void data_report(ReportWriter *writer,Trace *trace,AnnotationResolver *annotations,
                bool include_hwregs,bool include_7e7f)

{
  _Base_ptr p_Var1;
  uint resolve_adress;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  *p_Var5;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  size_t sVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  size_t sVar16;
  _Base_ptr p_Var17;
  undefined8 uVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  size_type sVar24;
  byte bVar25;
  pointer pMVar26;
  _Base_ptr p_Var27;
  undefined7 in_register_00000009;
  _Base_ptr p_Var28;
  _Rb_tree_header *p_Var29;
  _Rb_tree_header *p_Var30;
  uint uVar31;
  _Rb_tree_header *p_Var32;
  uint32_t j;
  ulong uVar33;
  Annotation *pAVar34;
  bool bVar35;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> new_unknown_writers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  new_readers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  new_writers;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> new_unknown_readers;
  AccessIterator readers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  global_writers;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> global_unknown_readers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  global_readers;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> global_unknown_writers;
  AccessIterator writers;
  Annotation *data;
  Profile profile;
  StringBuilder sb;
  uint local_122c;
  uint local_1224;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1220;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  local_11f0;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  local_11c0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1190;
  Annotation *local_1160;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_1158;
  uint local_1150;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  local_1148;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1118;
  undefined1 local_10e8 [16];
  _Base_ptr local_10d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10d0;
  _Alloc_hider local_10c0;
  undefined1 local_10b8 [8];
  _Rb_tree_node_base local_10b0;
  size_type local_1090;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1088;
  uint local_1078;
  Annotation *local_1070;
  uint local_1068;
  undefined4 local_1064;
  AnnotationResolver *local_1060;
  ReportWriter *local_1058;
  Profile local_1050;
  StringBuilder local_1034;
  
  local_1064 = (undefined4)CONCAT71(in_register_00000009,include_hwregs);
  local_1060 = annotations;
  memset(&local_1034,0,0x1004);
  local_1050._msg = "Data report";
  local_1050._start = clock();
  local_1050._hide_if_fast = true;
  ReportWriter::writeSeperator(writer,"Data analysis");
  local_1034._length = 0;
  local_1034._backing[0] = '\0';
  snestistics::StringBuilder::format(&local_1034,"DATA RANGE");
  snestistics::StringBuilder::column(&local_1034,0x14,4);
  snestistics::StringBuilder::format(&local_1034,"READERS");
  snestistics::StringBuilder::column(&local_1034,0x3c,4);
  snestistics::StringBuilder::format(&local_1034,"WRITERS");
  snestistics::StringBuilder::column(&local_1034,0x5a,4);
  snestistics::StringBuilder::format(&local_1034,"ANNOTATIONS");
  ReportWriter::writeSeperator(writer,local_1034._backing);
  local_10d0._M_allocated_capacity = (size_type)(local_10e8 + 8);
  local_10e8._8_4_ = _S_red;
  local_10d8 = (_Base_ptr)0x0;
  local_10c0._M_p = (pointer)0x0;
  local_1118._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1118._M_impl.super__Rb_tree_header._M_header;
  local_1118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1118._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1148._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1148._M_impl.super__Rb_tree_header._M_header;
  local_1148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_10b0._M_left = (_Base_ptr)(local_10b8 + 8);
  local_10b0._M_color = 0;
  local_10b0._M_parent = (_Base_ptr)0x0;
  local_1090 = 0;
  pMVar26 = (trace->memory_accesses).
            super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1148._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1148._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1118._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1118._M_impl.super__Rb_tree_header._M_header._M_left;
  local_10d0._8_8_ = local_10d0._M_allocated_capacity;
  local_10b0._M_right = local_10b0._M_left;
  local_1058 = writer;
  if ((trace->memory_accesses).
      super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar26) {
    local_122c = 0xffffffff;
    local_1224 = 0xffffffff;
    pAVar34 = (Annotation *)0x0;
    uVar33 = 0;
    do {
      resolve_adress = pMVar26[uVar33].adress;
      bVar25 = include_7e7f;
      if ((resolve_adress & 0xfe0000) != 0x7e0000) {
        bVar25 = (resolve_adress & 0xfc00) - 0x4400 < 0xffffdc00 | (byte)local_1064;
      }
      uVar33 = (ulong)((int)uVar33 + (uint)(bVar25 ^ 1));
      if ((bVar25 ^ 1) == 0) {
        local_1070 = (Annotation *)0x0;
        local_11f0._M_impl._0_8_ = 0;
        snestistics::AnnotationResolver::resolve_annotation
                  (local_1060,resolve_adress,(Annotation **)&local_11f0,&local_1070);
        if (local_11f0._M_impl._0_8_ != 0) {
          pMVar26 = (trace->memory_accesses).
                    super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (; (uVar33 < (ulong)((long)(trace->memory_accesses).
                                         super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar26
                                  >> 3) && (resolve_adress == pMVar26[uVar33].adress));
              uVar33 = (ulong)((int)uVar33 + 1)) {
          }
        }
        if (local_11f0._M_impl._0_8_ == 0) {
          local_11f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_11f0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_11f0._M_impl.super__Rb_tree_header._M_header;
          local_11f0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1190._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_1190._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_1190._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_1190._M_impl.super__Rb_tree_header._M_header;
          local_1190._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_11c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_11c0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_11c0._M_impl.super__Rb_tree_header._M_header;
          local_11c0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1220._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_1220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_1220._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_1220._M_impl.super__Rb_tree_header._M_header;
          local_1220._M_impl.super__Rb_tree_header._M_node_count = 0;
          pMVar26 = (trace->memory_accesses).
                    super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1220._M_impl.super__Rb_tree_header._M_header._M_right =
               local_1220._M_impl.super__Rb_tree_header._M_header._M_left;
          local_11f0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_11f0._M_impl.super__Rb_tree_header._M_header._M_left;
          local_11c0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_11c0._M_impl.super__Rb_tree_header._M_header._M_left;
          local_1190._M_impl.super__Rb_tree_header._M_header._M_right =
               local_1190._M_impl.super__Rb_tree_header._M_header._M_left;
          uVar31 = 0;
          if (uVar33 < (ulong)((long)(trace->memory_accesses).
                                     super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar26 >> 3
                              )) {
            uVar31 = 0;
            do {
              uVar2 = pMVar26[uVar33].adress;
              if (resolve_adress != uVar2) goto LAB_0013009b;
              uVar3 = pMVar26[uVar33].pc;
              local_1088._M_allocated_capacity =
                   CONCAT44(local_1088._M_allocated_capacity._4_4_,uVar3) & 0xffffffff7fffffff;
              local_1160 = (Annotation *)0x0;
              snestistics::AnnotationResolver::resolve_annotation
                        (local_1060,uVar3 & 0x7fffffff,&local_1160,(Annotation **)0x0);
              if (local_1160 == (Annotation *)0x0) {
                if ((int)uVar3 < 0) {
                  std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::_M_insert_unique<unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_1220,(uint *)&local_1088._M_allocated_capacity);
                  if (uVar31 == 0) {
                    p_Var27 = &local_1220._M_impl.super__Rb_tree_header._M_header;
                    if (local_1220._M_impl.super__Rb_tree_header._M_header._M_parent !=
                        (_Base_ptr)0x0) {
                      p_Var28 = local_1220._M_impl.super__Rb_tree_header._M_header._M_parent;
                      do {
                        bVar35 = (uint)*(size_t *)(p_Var28 + 1) <
                                 (uint)local_1088._M_allocated_capacity._0_4_;
                        if (!bVar35) {
                          p_Var27 = p_Var28;
                        }
                        p_Var28 = (&p_Var28->_M_left)[bVar35];
                      } while (p_Var28 != (_Base_ptr)0x0);
                    }
                    p_Var6 = &local_1220;
                    goto LAB_00130073;
                  }
                }
                else {
                  std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::_M_insert_unique<unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_1190,(uint *)&local_1088._M_allocated_capacity);
                  if (uVar31 == 0) {
                    p_Var27 = &local_1118._M_impl.super__Rb_tree_header._M_header;
                    if (local_1118._M_impl.super__Rb_tree_header._M_header._M_parent !=
                        (_Base_ptr)0x0) {
                      p_Var28 = local_1118._M_impl.super__Rb_tree_header._M_header._M_parent;
                      do {
                        bVar35 = (uint)*(size_t *)(p_Var28 + 1) <
                                 (uint)local_1088._M_allocated_capacity._0_4_;
                        if (!bVar35) {
                          p_Var27 = p_Var28;
                        }
                        p_Var28 = (&p_Var28->_M_left)[bVar35];
                      } while (p_Var28 != (_Base_ptr)0x0);
                    }
                    p_Var6 = &local_1118;
LAB_00130073:
                    p_Var30 = &(p_Var6->_M_impl).super__Rb_tree_header;
                    p_Var29 = p_Var30;
                    if ((_Rb_tree_header *)p_Var27 != p_Var30) {
                      bVar35 = (uint)local_1088._M_allocated_capacity._0_4_ <
                               (uint)((_Rb_tree_header *)p_Var27)->_M_node_count;
                      goto LAB_00130085;
                    }
                    goto LAB_0013008c;
                  }
                }
              }
              else if ((int)uVar3 < 0) {
                std::
                _Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                ::_M_insert_unique<snestistics::Annotation_const*const&>
                          ((_Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                            *)&local_11c0,&local_1160);
                if (uVar31 == 0) {
                  p_Var27 = &local_1148._M_impl.super__Rb_tree_header._M_header;
                  for (p_Var28 = local_1148._M_impl.super__Rb_tree_header._M_header._M_parent;
                      (_Rb_tree_header *)p_Var28 != (_Rb_tree_header *)0x0;
                      p_Var28 = (&p_Var28->_M_left)[*(Annotation **)(p_Var28 + 1) < local_1160]) {
                    if (*(Annotation **)(p_Var28 + 1) >= local_1160) {
                      p_Var27 = p_Var28;
                    }
                  }
                  p_Var5 = &local_1148;
                  goto LAB_00130007;
                }
              }
              else {
                std::
                _Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                ::_M_insert_unique<snestistics::Annotation_const*const&>
                          ((_Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                            *)&local_11f0,&local_1160);
                if (uVar31 == 0) {
                  p_Var27 = (_Base_ptr)(local_10e8 + 8);
                  for (p_Var28 = local_10d8; (_Rb_tree_header *)p_Var28 != (_Rb_tree_header *)0x0;
                      p_Var28 = (&p_Var28->_M_left)[*(Annotation **)(p_Var28 + 1) < local_1160]) {
                    if (*(Annotation **)(p_Var28 + 1) >= local_1160) {
                      p_Var27 = p_Var28;
                    }
                  }
                  p_Var5 = (_Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                            *)local_10e8;
LAB_00130007:
                  p_Var30 = &(p_Var5->_M_impl).super__Rb_tree_header;
                  p_Var29 = p_Var30;
                  if ((_Rb_tree_header *)p_Var27 != p_Var30) {
                    bVar35 = local_1160 < (Annotation *)((_Rb_tree_header *)p_Var27)->_M_node_count;
LAB_00130085:
                    p_Var29 = (_Rb_tree_header *)p_Var27;
                    if (bVar35) {
                      p_Var29 = p_Var30;
                    }
                  }
LAB_0013008c:
                  if (p_Var29 == p_Var30) {
                    uVar31 = 1;
                  }
                }
              }
LAB_0013009b:
              if (resolve_adress != uVar2) break;
              uVar33 = (ulong)((int)uVar33 + 1);
              pMVar26 = (trace->memory_accesses).
                        super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar33 < (ulong)((long)(trace->memory_accesses).
                                            super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pMVar26 >> 3));
          }
          local_1068 = uVar31;
          if (local_1070 != pAVar34) {
            local_1068 = 1;
          }
          if (local_122c != 0xffffffff) {
            if (((pointer)local_11f0._M_impl.super__Rb_tree_header._M_node_count != local_10c0._M_p)
               || (local_1118._M_impl.super__Rb_tree_header._M_node_count !=
                   local_1190._M_impl.super__Rb_tree_header._M_node_count)) {
              local_1068 = 1;
            }
            if ((local_11c0._M_impl.super__Rb_tree_header._M_node_count !=
                 local_1148._M_impl.super__Rb_tree_header._M_node_count) ||
               (local_1090 != local_1220._M_impl.super__Rb_tree_header._M_node_count)) {
              local_1068 = 1;
            }
          }
          bVar35 = local_122c == 0xffffffff;
          local_1160 = (Annotation *)local_10e8;
          local_1158 = &local_1118;
          local_1150 = 0;
          local_1088._M_allocated_capacity = (size_type)&local_1148;
          local_1088._8_8_ = local_10e8 + 0x30;
          local_1078 = 0;
          if (local_1068 != 0) {
            bVar4 = true;
            do {
              uVar2 = local_1078;
              uVar31 = local_1150;
              if ((uint)((int)local_1118._M_impl.super__Rb_tree_header._M_node_count +
                        (int)local_10c0._M_p) <= local_1150) {
                uVar3 = resolve_adress;
                if ((uint)((int)local_1090 +
                          (int)local_1148._M_impl.super__Rb_tree_header._M_node_count) <= local_1078
                   ) goto LAB_00130308;
              }
              local_1034._length = 0;
              local_1034._backing[0] = '\0';
              if (bVar4) {
                if (local_122c == local_1224) {
                  snestistics::StringBuilder::format(&local_1034,"%06X");
                }
                else {
                  snestistics::StringBuilder::format(&local_1034,"%06X-%06X");
                }
              }
              if (uVar31 < (uint)((int)local_1118._M_impl.super__Rb_tree_header._M_node_count +
                                 (int)local_10c0._M_p)) {
                snestistics::StringBuilder::column(&local_1034,0x14,4);
                data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
                AnnotationResolver_const&,bool,bool)::AccessIterator::emit(snestistics::
                StringBuilder__(&local_1160,&local_1034);
              }
              if (uVar2 < (uint)((int)local_1090 +
                                (int)local_1148._M_impl.super__Rb_tree_header._M_node_count)) {
                snestistics::StringBuilder::column(&local_1034,0x3c,4);
                data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
                AnnotationResolver_const&,bool,bool)::AccessIterator::emit(snestistics::
                StringBuilder__(&local_1088,&local_1034);
              }
              if ((bool)(bVar4 & pAVar34 != (Annotation *)0x0)) {
                snestistics::StringBuilder::column(&local_1034,0x5a,4);
                snestistics::StringBuilder::format
                          (&local_1034,"%s [%06X-%06X]",(pAVar34->name)._M_dataplus._M_p,
                           (ulong)pAVar34->startOfRange,(ulong)pAVar34->endOfRange);
              }
              ReportWriter::writeComment(local_1058,&local_1034);
              local_1150 = uVar31 + 1;
              local_1078 = uVar2 + 1;
              bVar4 = false;
            } while( true );
          }
          uVar3 = local_122c;
          if (local_122c == 0xffffffff) {
            uVar3 = resolve_adress;
          }
LAB_00130308:
          local_122c = uVar3;
          sVar24 = local_1090;
          p_Var23 = local_10b0._M_right;
          p_Var22 = local_10b0._M_left;
          p_Var21 = local_10b0._M_parent;
          _Var20._M_p = local_10c0._M_p;
          uVar19 = local_10d0._8_8_;
          uVar18 = local_10d0._M_allocated_capacity;
          p_Var17 = local_10d8;
          sVar16 = local_1118._M_impl.super__Rb_tree_header._M_node_count;
          p_Var15 = local_1118._M_impl.super__Rb_tree_header._M_header._M_right;
          p_Var14 = local_1118._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var13 = local_1118._M_impl.super__Rb_tree_header._M_header._M_parent;
          sVar12 = local_1148._M_impl.super__Rb_tree_header._M_node_count;
          p_Var11 = local_1148._M_impl.super__Rb_tree_header._M_header._M_right;
          p_Var10 = local_1148._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var9 = local_1148._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var8 = local_1190._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var7 = local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var28 = local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var27 = local_1220._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (bVar35 || (local_1068 & 1) != 0) {
            if (local_10d8 == (_Base_ptr)0x0) {
              if (local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_10e8._8_4_ = local_11f0._M_impl.super__Rb_tree_header._M_header._M_color;
                local_10d8 = local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_10d0._M_allocated_capacity =
                     (size_type)local_11f0._M_impl.super__Rb_tree_header._M_header._M_left;
                local_10d0._8_8_ = local_11f0._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     (_Base_ptr)(local_10e8 + 8);
                local_10c0._M_p = (pointer)local_11f0._M_impl.super__Rb_tree_header._M_node_count;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_11f0._M_impl.super__Rb_tree_header._M_header;
                local_11f0._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_11f0._M_impl.super__Rb_tree_header._M_header._M_left;
              }
            }
            else {
              p_Var1 = (_Base_ptr)(local_10e8 + 8);
              if (local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_color = local_10e8._8_4_;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent = local_10d8;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_left =
                     (_Base_ptr)local_10d0._M_allocated_capacity;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_right =
                     (_Base_ptr)local_10d0._8_8_;
                local_10d8->_M_parent = &local_11f0._M_impl.super__Rb_tree_header._M_header;
                local_11f0._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_10c0._M_p;
                local_10d8 = (_Base_ptr)0x0;
                local_10c0._M_p = (pointer)0x0;
                local_10d0._M_allocated_capacity = (size_type)p_Var1;
                local_10d0._8_8_ = p_Var1;
              }
              else {
                local_10d8 = local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var17;
                local_10d0._M_allocated_capacity =
                     (size_type)local_11f0._M_impl.super__Rb_tree_header._M_header._M_left;
                local_10d0._8_8_ = local_11f0._M_impl.super__Rb_tree_header._M_header._M_right;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)uVar18;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar19;
                p_Var28->_M_parent = p_Var1;
                p_Var17->_M_parent = &local_11f0._M_impl.super__Rb_tree_header._M_header;
                local_10c0._M_p = (pointer)local_11f0._M_impl.super__Rb_tree_header._M_node_count;
                local_11f0._M_impl.super__Rb_tree_header._M_node_count = (size_t)_Var20._M_p;
              }
            }
            p_Var32 = &local_1220._M_impl.super__Rb_tree_header;
            p_Var30 = &local_1148._M_impl.super__Rb_tree_header;
            p_Var29 = &local_1118._M_impl.super__Rb_tree_header;
            if (local_1148._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              if (local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_1148._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_11c0._M_impl.super__Rb_tree_header._M_header._M_color;
                local_1148._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_1148._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_11c0._M_impl.super__Rb_tree_header._M_header._M_left;
                local_1148._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_11c0._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var30->_M_header;
                local_1148._M_impl.super__Rb_tree_header._M_node_count =
                     local_11c0._M_impl.super__Rb_tree_header._M_node_count;
                local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_11c0._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_11c0._M_impl.super__Rb_tree_header._M_header;
                local_11c0._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_11c0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_11c0._M_impl.super__Rb_tree_header._M_header._M_left;
              }
            }
            else if (local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
            {
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_color =
                   local_1148._M_impl.super__Rb_tree_header._M_header._M_color;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_1148._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_1148._M_impl.super__Rb_tree_header._M_header._M_left;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_1148._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_1148._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &local_11c0._M_impl.super__Rb_tree_header._M_header;
              local_11c0._M_impl.super__Rb_tree_header._M_node_count =
                   local_1148._M_impl.super__Rb_tree_header._M_node_count;
              local_1148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_1148._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_1148._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var30->_M_header;
              local_1148._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var30->_M_header;
            }
            else {
              local_1148._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var9;
              local_1148._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_11c0._M_impl.super__Rb_tree_header._M_header._M_left;
              local_1148._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_11c0._M_impl.super__Rb_tree_header._M_header._M_right;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_left = p_Var10;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_right = p_Var11;
              p_Var7->_M_parent = &p_Var30->_M_header;
              p_Var9->_M_parent = &local_11c0._M_impl.super__Rb_tree_header._M_header;
              local_1148._M_impl.super__Rb_tree_header._M_node_count =
                   local_11c0._M_impl.super__Rb_tree_header._M_node_count;
              local_11c0._M_impl.super__Rb_tree_header._M_node_count = sVar12;
            }
            if (local_1118._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              if (local_1190._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_1118._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_1190._M_impl.super__Rb_tree_header._M_header._M_color;
                local_1118._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_1190._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_1118._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_1190._M_impl.super__Rb_tree_header._M_header._M_left;
                local_1118._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1190._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_1190._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var29->_M_header;
                local_1118._M_impl.super__Rb_tree_header._M_node_count =
                     local_1190._M_impl.super__Rb_tree_header._M_node_count;
                local_1190._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_1190._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_1190._M_impl.super__Rb_tree_header._M_header;
                local_1190._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_1190._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1190._M_impl.super__Rb_tree_header._M_header._M_left;
              }
            }
            else if (local_1190._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
            {
              local_1190._M_impl.super__Rb_tree_header._M_header._M_color =
                   local_1118._M_impl.super__Rb_tree_header._M_header._M_color;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_1118._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_1118._M_impl.super__Rb_tree_header._M_header._M_left;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_1118._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_1118._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &local_1190._M_impl.super__Rb_tree_header._M_header;
              local_1190._M_impl.super__Rb_tree_header._M_node_count =
                   local_1118._M_impl.super__Rb_tree_header._M_node_count;
              local_1118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_1118._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_1118._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var29->_M_header;
              local_1118._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var29->_M_header;
            }
            else {
              local_1118._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_1190._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var13;
              local_1118._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_1190._M_impl.super__Rb_tree_header._M_header._M_left;
              local_1118._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_1190._M_impl.super__Rb_tree_header._M_header._M_right;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_left = p_Var14;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_right = p_Var15;
              p_Var8->_M_parent = &p_Var29->_M_header;
              p_Var13->_M_parent = &local_1190._M_impl.super__Rb_tree_header._M_header;
              local_1118._M_impl.super__Rb_tree_header._M_node_count =
                   local_1190._M_impl.super__Rb_tree_header._M_node_count;
              local_1190._M_impl.super__Rb_tree_header._M_node_count = sVar16;
            }
            pAVar34 = local_1070;
            if (local_10b0._M_parent == (_Base_ptr)0x0) {
              if (local_1220._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_10b0._M_color = local_1220._M_impl.super__Rb_tree_header._M_header._M_color;
                local_10b0._M_parent = local_1220._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_10b0._M_left = local_1220._M_impl.super__Rb_tree_header._M_header._M_left;
                local_10b0._M_right = local_1220._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_1220._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     (_Base_ptr)(local_10b8 + 8);
                local_1090 = local_1220._M_impl.super__Rb_tree_header._M_node_count;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_1220._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var32->_M_header;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var32->_M_header;
              }
            }
            else if (local_1220._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
            {
              local_1220._M_impl.super__Rb_tree_header._M_header._M_color = local_10b0._M_color;
              local_1220._M_impl.super__Rb_tree_header._M_header._M_parent = local_10b0._M_parent;
              local_1220._M_impl.super__Rb_tree_header._M_header._M_left = local_10b0._M_left;
              local_1220._M_impl.super__Rb_tree_header._M_header._M_right = local_10b0._M_right;
              *(_Rb_tree_header **)((long)local_10b0._M_parent + 8) = p_Var32;
              local_1220._M_impl.super__Rb_tree_header._M_node_count = local_1090;
              local_10b0._M_parent = (_Base_ptr)0x0;
              local_10b0._M_left = (_Base_ptr)(local_10b8 + 8);
              local_1090 = 0;
              local_10b0._M_right = local_10b0._M_left;
            }
            else {
              local_10b0._M_parent = local_1220._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_1220._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var21;
              local_10b0._M_left = local_1220._M_impl.super__Rb_tree_header._M_header._M_left;
              local_10b0._M_right = local_1220._M_impl.super__Rb_tree_header._M_header._M_right;
              local_1220._M_impl.super__Rb_tree_header._M_header._M_left = p_Var22;
              local_1220._M_impl.super__Rb_tree_header._M_header._M_right = p_Var23;
              p_Var27->_M_parent = (_Base_ptr)(local_10b8 + 8);
              *(_Rb_tree_header **)((long)p_Var21 + 8) = p_Var32;
              local_1090 = local_1220._M_impl.super__Rb_tree_header._M_node_count;
              local_1220._M_impl.super__Rb_tree_header._M_node_count = sVar24;
            }
          }
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_1220);
          std::
          _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
          ::~_Rb_tree(&local_11c0);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_1190);
          std::
          _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
          ::~_Rb_tree(&local_11f0);
          local_1224 = resolve_adress;
        }
      }
      pMVar26 = (trace->memory_accesses).
                super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar33 < (ulong)((long)(trace->memory_accesses).
                                    super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar26 >> 3)
            );
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)(local_10e8 + 0x30));
  std::
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  ::~_Rb_tree(&local_1148);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_1118);
  std::
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  ::~_Rb_tree((_Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
               *)local_10e8);
  snestistics::Profile::~Profile(&local_1050);
  return;
}

Assistant:

void data_report(ReportWriter &writer, const Trace &trace, const AnnotationResolver &annotations, const bool include_hwregs = true, const bool include_7e7f = true) {
	StringBuilder sb;

	Profile profile("Data report", true);
	writer.writeSeperator("Data analysis");

	sb.clear();
	sb.format("DATA RANGE");
	sb.column(20);
	sb.format("READERS");
	sb.column(60);
	sb.format("WRITERS");
	sb.column(90);
	sb.format("ANNOTATIONS");
	writer.writeSeperator(sb.c_str());

	Pointer first_global = INVALID_POINTER, last_global = INVALID_POINTER;

	std::set<const Annotation*> global_readers;
	std::set<uint32_t> global_unknown_readers;
	std::set<const Annotation*> global_writers;
	std::set<uint32_t> global_unknown_writers;
	const Annotation *global_data = nullptr;

	for (uint32_t p = 0; p < trace.memory_accesses.size(); ) {
		const Trace::MemoryAccess ra = trace.memory_accesses[p];
		Pointer adress = ra.adress;

		// This code ignores data reads from WRAM and/or hardware registers (if requested)
		{
			const uint8_t bank = adress>>16;
			const uint32_t bank_less_adress = adress&0xFFFF;
			if (bank == 0x7E || bank == 0x7F) {
				if (!include_7e7f) {
					p++;
					continue;
				}
			} else if (!include_hwregs && bank_less_adress >= 0x2000 && bank_less_adress <= 0x43FF) {
				p++;
				continue;
			}
		}

		const Annotation *data = nullptr;

		// Don't care about accesses to code
		// TODO: Check so we don't write code?
		{
			const Annotation *accessed_function = nullptr;
			annotations.resolve_annotation(adress, &accessed_function, &data);
			if (accessed_function != nullptr) {
				for (uint32_t j=p; j<trace.memory_accesses.size(); j++, p++) {
					const Trace::MemoryAccess rb = trace.memory_accesses[j];
					if (adress != rb.adress) break;
				}
				continue;
			}
		}

		bool need_flush = false;
		std::set<const Annotation*> new_readers;
		std::set<uint32_t> new_unknown_readers;
		std::set<const Annotation*> new_writers;
		std::set<uint32_t> new_unknown_writers;

		for (uint32_t j=p; j<trace.memory_accesses.size(); j++, p++) {
			const Trace::MemoryAccess rb = trace.memory_accesses[j];
			if (adress != rb.adress) break;

			const bool is_write = (rb.pc & 0x80000000)!=0;
			const Pointer pc = is_write ? rb.pc & ~0x80000000 : rb.pc;

			const Annotation *our_function = nullptr;
			annotations.resolve_annotation(pc, &our_function);

			if (our_function) {
				if (is_write) {
					new_writers.insert(our_function);
					if (!need_flush && global_writers.find(our_function) == global_writers.end()) need_flush = true;
				} else {
					new_readers.insert(our_function);
					if (!need_flush && global_readers.find(our_function) == global_readers.end()) need_flush = true;
				}
			} else {
				if (is_write) {
					new_unknown_writers.insert(pc);
					if (!need_flush && new_unknown_writers.find(pc) == new_unknown_writers.end()) need_flush = true;
				} else {
					new_unknown_readers.insert(pc);
					if (!need_flush && global_unknown_readers.find(pc) == global_unknown_readers.end()) need_flush = true;
				}
			}
		}

		if (data != global_data)
			need_flush = true;

		// We know that we aren't adding any new readers/writers, but did we produce the same full list?
		if (first_global != INVALID_POINTER) {
			if ((new_readers.size() != global_readers.size()) || (global_unknown_readers.size() != new_unknown_readers.size())) {
				need_flush = true;
			}
			if ((new_writers.size() != global_writers.size()) || (global_unknown_writers.size() != new_unknown_writers.size())) {
				need_flush = true;
			}
		}

		bool update_globals = false;
		if (need_flush || first_global == INVALID_POINTER) {
			update_globals = true;
		}

		struct AccessIterator {
			AccessIterator(const std::set<const Annotation*> &known, const std::set<uint32_t> &unknown) : _known(known), _unknown(unknown) {}
			const std::set<const Annotation*> &_known;
			const std::set<uint32_t> &_unknown;

			uint32_t _current = 0;
			bool has() {
				const uint32_t total = (uint32_t)_known.size() + (uint32_t)_unknown.size();
				return _current < total;
			}
			void advance() {
				_current++;
			}
			void emit(StringBuilder &sb) {
				if (_current < _known.size()) {
					auto it = _known.begin();
					for (uint32_t i=0; i<_current; i++, it++);
					const Annotation *a = *it;
					sb.format("%s", a->name.c_str());
				} else {
					uint32_t lc = _current - (uint32_t)_known.size();
					auto it = _unknown.begin();
					for (uint32_t i=0; i<lc; i++, it++);
					const uint32_t pc = *it;
					sb.format("%06X", pc);
				}
			}
		};

		AccessIterator readers(global_readers, global_unknown_readers);
		AccessIterator writers(global_writers, global_unknown_writers);

		// If last range was finished, print it
		if (need_flush) {
			bool first_line = true;
			while (readers.has() || writers.has()) {
				sb.clear();
				if (first_line) {
					if (first_global != last_global)
						sb.format("%06X-%06X", first_global, last_global);
					else
						sb.format("%06X", first_global);
				}
				if (readers.has()) {
					sb.column(20);
					readers.emit(sb);
				}
				if (writers.has()) {
					sb.column(60);
					writers.emit(sb);
				}
				if (first_line) {
					if (global_data) {
						sb.column(90);
						sb.format("%s [%06X-%06X]", global_data->name.c_str(), global_data->startOfRange, global_data->endOfRange);
					}
				}
				writer.writeComment(sb);
				first_line = false;
				readers.advance();
				writers.advance();
			}
			first_global = last_global = adress;
		} else {
			if (first_global == INVALID_POINTER) first_global = adress;
			last_global = adress;
		}
		
		if (update_globals) {
			std::swap(global_readers, new_readers);
			std::swap(global_writers, new_writers);
			std::swap(global_unknown_readers, new_unknown_readers);
			std::swap(global_unknown_writers, new_unknown_writers);
			global_data = data;
		}
	}

	// TODO: Print last range
}